

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::CompExp(SQCompiler *this)

{
  long lVar1;
  long *in_RDI;
  SQCompiler *in_stack_ffffffffffffffc0;
  code *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd8;
  SQOpcode op;
  SQCompiler *in_stack_ffffffffffffffe0;
  
  ShiftExp(in_stack_ffffffffffffffc0);
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while (lVar1 = *in_RDI, lVar1 == 0x3c) {
              in_stack_ffffffffffffffd8 = 0;
              in_stack_ffffffffffffffe0 = (SQCompiler *)0x0;
              BIN_EXP<void(SQCompiler::*)()>
                        ((SQCompiler *)0x0,_OP_LINE,
                         (offset_in_SQCompiler_to_subr)in_stack_ffffffffffffffc8,
                         (SQInteger)in_stack_ffffffffffffffc0);
            }
            op = (SQOpcode)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
            if (lVar1 != 0x3e) break;
            BIN_EXP<void(SQCompiler::*)()>
                      (in_stack_ffffffffffffffe0,op,
                       (offset_in_SQCompiler_to_subr)in_stack_ffffffffffffffc8,
                       (SQInteger)in_stack_ffffffffffffffc0);
          }
          if (lVar1 != 0x10a) break;
          in_stack_ffffffffffffffc0 = (SQCompiler *)0x0;
          BIN_EXP<void(SQCompiler::*)()>
                    (in_stack_ffffffffffffffe0,op,
                     (offset_in_SQCompiler_to_subr)in_stack_ffffffffffffffc8,0);
        }
        if (lVar1 != 0x10b) break;
        in_stack_ffffffffffffffc8 = ShiftExp;
        BIN_EXP<void(SQCompiler::*)()>
                  (in_stack_ffffffffffffffe0,op,0x11ced0,(SQInteger)in_stack_ffffffffffffffc0);
      }
      if (lVar1 != 0x118) break;
      BIN_EXP<void(SQCompiler::*)()>
                (in_stack_ffffffffffffffe0,op,
                 (offset_in_SQCompiler_to_subr)in_stack_ffffffffffffffc8,
                 (SQInteger)in_stack_ffffffffffffffc0);
    }
    if (lVar1 != 0x137) break;
    BIN_EXP<void(SQCompiler::*)()>
              (in_stack_ffffffffffffffe0,op,(offset_in_SQCompiler_to_subr)in_stack_ffffffffffffffc8,
               (SQInteger)in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void CompExp()
    {
        ShiftExp();
        for(;;) switch(_token) {
        case _SC('>'): BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_G); break;
        case _SC('<'): BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_L); break;
        case TK_GE: BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_GE); break;
        case TK_LE: BIN_EXP(_OP_CMP, &SQCompiler::ShiftExp,CMP_LE); break;
        case TK_IN: BIN_EXP(_OP_EXISTS, &SQCompiler::ShiftExp); break;
        case TK_INSTANCEOF: BIN_EXP(_OP_INSTANCEOF, &SQCompiler::ShiftExp); break;
        default: return;
        }
    }